

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

list<SectionInfo,_std::allocator<SectionInfo>_> * __thiscall
ArgsManager::GetUnrecognizedSections_abi_cxx11_
          (list<SectionInfo,_std::allocator<SectionInfo>_> *__return_storage_ptr__,ArgsManager *this
          )

{
  size_t *psVar1;
  string *psVar2;
  string *psVar3;
  int iVar4;
  const_iterator cVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long lVar7;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  allocator_type local_e1;
  unique_lock<std::recursive_mutex> local_e0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((GetUnrecognizedSections[abi:cxx11]()::available_sections_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&GetUnrecognizedSections[abi:cxx11]()::
                                   available_sections_abi_cxx11_), iVar4 != 0)) {
    ChainTypeToString_abi_cxx11_(&local_d0,REGTEST);
    ChainTypeToString_abi_cxx11_(&local_b0,SIGNET);
    ChainTypeToString_abi_cxx11_(&local_90,TESTNET);
    ChainTypeToString_abi_cxx11_(&local_70,TESTNET4);
    ChainTypeToString_abi_cxx11_(&local_50,MAIN);
    __l._M_len = 5;
    __l._M_array = &local_d0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(&GetUnrecognizedSections[abi:cxx11]()::available_sections_abi_cxx11_,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &local_e0,&local_e1);
    lVar7 = -0xa0;
    paVar6 = &local_50.field_2;
    do {
      if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar6->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar6->_M_allocated_capacity)[-2],
                        paVar6->_M_allocated_capacity + 1);
      }
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar6->_M_allocated_capacity + -4);
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0);
    __cxa_atexit(std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~set,&GetUnrecognizedSections[abi:cxx11]()::available_sections_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetUnrecognizedSections[abi:cxx11]()::available_sections_abi_cxx11_);
  }
  local_e0._M_owns = false;
  local_e0._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&local_e0);
  std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::list
            (__return_storage_ptr__,&this->m_config_sections);
  local_d0._M_dataplus._M_p = (pointer)&local_d0;
  local_d0.field_2._M_allocated_capacity = 0;
  local_d0._M_string_length = (size_type)local_d0._M_dataplus._M_p;
  psVar2 = (string *)
           (__return_storage_ptr__->super__List_base<SectionInfo,_std::allocator<SectionInfo>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  while (psVar3 = psVar2, psVar3 != (string *)__return_storage_ptr__) {
    psVar2 = (string *)(psVar3->_M_dataplus)._M_p;
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&GetUnrecognizedSections[abi:cxx11]()::available_sections_abi_cxx11_._M_t,
                   (key_type *)&psVar3->field_2);
    if (((_Rb_tree_header *)cVar5._M_node !=
         &GetUnrecognizedSections[abi:cxx11]()::available_sections_abi_cxx11_._M_t._M_impl.
          super__Rb_tree_header) &&
       ((string *)(psVar3->_M_dataplus)._M_p != (string *)local_d0._M_dataplus._M_p &&
        (string *)local_d0._M_dataplus._M_p != psVar3)) {
      std::__detail::_List_node_base::_M_transfer
                ((_List_node_base *)local_d0._M_dataplus._M_p,(_List_node_base *)psVar3);
      local_d0.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity + 1;
      psVar1 = &(__return_storage_ptr__->super__List_base<SectionInfo,_std::allocator<SectionInfo>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
    }
  }
  std::__cxx11::_List_base<SectionInfo,_std::allocator<SectionInfo>_>::_M_clear
            ((_List_base<SectionInfo,_std::allocator<SectionInfo>_> *)&local_d0);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_e0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::list<SectionInfo> ArgsManager::GetUnrecognizedSections() const
{
    // Section names to be recognized in the config file.
    static const std::set<std::string> available_sections{
        ChainTypeToString(ChainType::REGTEST),
        ChainTypeToString(ChainType::SIGNET),
        ChainTypeToString(ChainType::TESTNET),
        ChainTypeToString(ChainType::TESTNET4),
        ChainTypeToString(ChainType::MAIN),
    };

    LOCK(cs_args);
    std::list<SectionInfo> unrecognized = m_config_sections;
    unrecognized.remove_if([](const SectionInfo& appeared){ return available_sections.find(appeared.m_name) != available_sections.end(); });
    return unrecognized;
}